

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

void deqp::gles31::Functional::checkProgramResourceUsage
               (Program *program,Functions *gl,TestLog *log)

{
  int iVar1;
  Functions *program_00;
  bool bVar2;
  bool bVar3;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar4;
  size_type sVar5;
  const_reference ppSVar6;
  MessageBuilder *this;
  NotSupportedError *this_00;
  allocator<char> local_1d9;
  string local_1d8;
  MessageBuilder local_1a8;
  int local_28;
  bool local_21;
  int shaderNdx;
  bool limitExceeded;
  TestLog *log_local;
  Functions *gl_local;
  Program *program_local;
  
  local_21 = false;
  local_28 = 0;
  _shaderNdx = log;
  log_local = (TestLog *)gl;
  gl_local = (Functions *)program;
  while( true ) {
    iVar1 = local_28;
    pvVar4 = ProgramInterfaceDefinition::Program::getShaders((Program *)gl_local);
    sVar5 = std::
            vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
            ::size(pvVar4);
    program_00 = gl_local;
    if ((int)sVar5 <= iVar1) break;
    pvVar4 = ProgramInterfaceDefinition::Program::getShaders((Program *)gl_local);
    ppSVar6 = std::
              vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
              ::operator[](pvVar4,(long)local_28);
    bVar2 = checkShaderResourceUsage
                      ((Program *)program_00,*ppSVar6,(Functions *)log_local,_shaderNdx);
    local_21 = (local_21 & 1U) != 0 || ((bVar2 ^ 0xffU) & 1) != 0;
    local_28 = local_28 + 1;
  }
  bVar3 = checkProgramCombinedResourceUsage((Program *)gl_local,(Functions *)log_local,_shaderNdx);
  bVar2 = (local_21 & 1U) != 0;
  bVar3 = ((bVar3 ^ 0xffU) & 1) != 0;
  local_21 = bVar2 || bVar3;
  if (bVar2 || bVar3) {
    tcu::TestLog::operator<<(&local_1a8,_shaderNdx,(BeginMessageToken *)&tcu::TestLog::Message);
    this = tcu::MessageBuilder::operator<<
                     (&local_1a8,(char (*) [37])"One or more resource limits exceeded");
    tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"one or more resource limits exceeded",&local_1d9);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_1d8);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  return;
}

Assistant:

void checkProgramResourceUsage (const ProgramInterfaceDefinition::Program* program, const glw::Functions& gl, tcu::TestLog& log)
{
	bool limitExceeded = false;

	for (int shaderNdx = 0; shaderNdx < (int)program->getShaders().size(); ++shaderNdx)
		limitExceeded |= !checkShaderResourceUsage(program, program->getShaders()[shaderNdx], gl, log);

	limitExceeded |= !checkProgramCombinedResourceUsage(program, gl, log);

	if (limitExceeded)
	{
		log << tcu::TestLog::Message << "One or more resource limits exceeded" << tcu::TestLog::EndMessage;
		throw tcu::NotSupportedError("one or more resource limits exceeded");
	}
}